

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZFNMatrix<0,_double> *unaff_retaddr;
  void **in_stack_ffffffffffffffd8;
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *in_stack_ffffffffffffffe0;
  double *val;
  int64_t col;
  TPZRegisterClassId *row;
  
  col = 0;
  val = (double *)0x21;
  row = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024c3a10);
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c36c8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c36c8;
  TPZFNMatrix<0,_double>::TPZFNMatrix(unaff_retaddr,(int64_t)row,col,val);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}